

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O3

void __thiscall HashTable<int>::diaplay(HashTable<int> *this)

{
  ostream *poVar1;
  node *pnVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (this->HashArray[lVar3].key != 9999999) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"key:",4);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->HashArray[lVar3].key)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tvalue:",7);
      std::ostream::operator<<(poVar1,this->HashArray[lVar3].value);
      for (pnVar2 = this->HashArray[lVar3].next; pnVar2 != (node *)0x0; pnVar2 = pnVar2->next) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tkey:",5);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pnVar2->key);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tvalue:",7);
        std::ostream::operator<<(poVar1,pnVar2->value);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x14);
  return;
}

Assistant:

void diaplay() {
		for (int i = 0; i < 20; i++) {
			if (HashArray[i].key != MyNull) {
				cout <<"key:"<< HashArray[i].key << "	value:" << HashArray[i].value;
				Node *p = &HashArray[i];
				while (p->next != NULL) {
					p = p->next;
					cout <<"	key:"<< p->key << "	value:" << p->value;
				}
				cout << endl;
			}
		}
	}